

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::XmlSerializer::ImportVertices(XmlSerializer *this,aiMesh *mesh)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  ulong uVar4;
  aiVector3t<float> *paVar5;
  iterator __first;
  iterator __last;
  aiVector3D aVar6;
  aiVector3t<float> *local_b8;
  value_type local_48 [2];
  undefined1 local_30 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  aiMesh *mesh_local;
  XmlSerializer *this_local;
  
  vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)mesh;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  while (bVar1 = ReadToEndElement(this,(string *)XmlTag::vertices_abi_cxx11_), bVar1) {
    iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    bVar1 = std::operator==((char *)CONCAT44(extraout_var,iVar2),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            XmlTag::vertex_abi_cxx11_);
    if (bVar1) {
      aVar6 = ReadVertex(this);
      local_48[0].z = aVar6.z;
      local_48[0]._0_8_ = aVar6._0_8_;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30,local_48
                );
    }
  }
  sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  (vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage)->y = (float)sVar3;
  uVar4 = (ulong)(uint)(vertices.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)->y;
  paVar5 = (aiVector3t<float> *)operator_new__(uVar4 * 0xc);
  if (uVar4 != 0) {
    local_b8 = paVar5;
    do {
      aiVector3t<float>::aiVector3t(local_b8);
      local_b8 = local_b8 + 1;
    } while (local_b8 != paVar5 + uVar4);
  }
  *(aiVector3t<float> **)
   &vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[1].y = paVar5;
  __first = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  __last = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  std::
  copy<__gnu_cxx::__normal_iterator<aiVector3t<float>*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
            ((__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
              )__first._M_current,
             (__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
              )__last._M_current,
             *(aiVector3t<float> **)
              &vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage[1].y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  return;
}

Assistant:

void ImportVertices(aiMesh* mesh) {
        std::vector<aiVector3D> vertices;
        while(ReadToEndElement(D3MF::XmlTag::vertices)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::vertex) {
                vertices.push_back(ReadVertex());
            }
        }
        mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
        mesh->mVertices = new aiVector3D[mesh->mNumVertices];

        std::copy(vertices.begin(), vertices.end(), mesh->mVertices);
    }